

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O3

void __thiscall TimeTest_Format_Test::TestBody(TimeTest_Format_Test *this)

{
  bool bVar1;
  char *message;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  AssertionResult gtest_ar;
  tm tm;
  internal local_2b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  undefined8 *local_288;
  code *local_280;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  undefined1 *local_268;
  long local_260;
  undefined8 local_258;
  undefined1 local_250 [504];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_288 = &local_58;
  uStack_40 = 0;
  local_58 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_48 = 0x7400000003;
  uStack_50 = 0x1900000000;
  local_280 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<tm>;
  local_260 = 0;
  local_270.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_0016b000
  ;
  local_258 = 500;
  format_str.size_ = 0x18;
  format_str.data_ = "The date is {:%Y-%m-%d}.";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_288;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,tm>
                ::TYPES;
  local_268 = local_250;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_270,format_str,args,(locale_ref)0x0);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_268,local_268 + local_260);
  local_270.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_0016b000
  ;
  if (local_268 != local_250) {
    operator_delete(local_268);
  }
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            (local_2b8,"\"The date is 2016-04-25.\"","fmt::format(\"The date is {:%Y-%m-%d}.\", tm)"
             ,(char (*) [24])"The date is 2016-04-25.",&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_270);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/time-test.cc"
               ,0x16,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_270.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_270.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_270.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(TimeTest, Format) {
  std::tm tm = std::tm();
  tm.tm_year = 116;
  tm.tm_mon  = 3;
  tm.tm_mday = 25;
  EXPECT_EQ("The date is 2016-04-25.",
            fmt::format("The date is {:%Y-%m-%d}.", tm));
}